

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colour_filters.cpp
# Opt level: O1

Mat * filter_arrow(Mat *img,array<cv::Mat,_5UL> *target_filled,bool debug)

{
  _InputArray *p_Var1;
  char in_CL;
  undefined7 in_register_00000011;
  long lVar2;
  int in_R8D;
  char *__end;
  char *__end_2;
  array<cv::Mat,_4UL> colours;
  undefined8 local_768;
  undefined8 uStack_760;
  undefined8 local_758;
  undefined8 uStack_750;
  undefined8 local_748;
  undefined8 uStack_740;
  undefined8 local_738;
  undefined8 uStack_730;
  undefined8 local_728;
  undefined8 uStack_720;
  undefined8 local_718;
  undefined8 uStack_710;
  Mat *local_708;
  Mat *pMStack_700;
  Size local_6f8;
  undefined8 uStack_6f0;
  Mat local_698 [96];
  Mat aMStack_638 [144];
  undefined8 local_5a8;
  undefined8 local_5a0;
  long *local_598;
  Mat *pMStack_590;
  Size SStack_588;
  undefined8 uStack_580;
  Mat local_528 [96];
  Mat aMStack_4c8 [152];
  _InputArray local_430 [4];
  _InputArray local_3d0 [4];
  undefined1 local_370 [16];
  Size SStack_360;
  Mat local_300 [96];
  Mat aMStack_2a0 [144];
  _OutputArray local_210 [4];
  Mat local_1b0 [96];
  Mat local_150 [96];
  Mat local_f0 [96];
  undefined1 local_90 [96];
  
  local_728 = 0x406fe00000000000;
  uStack_720 = 0;
  local_718 = 0;
  uStack_710 = 0;
  filter_yellow((Mat *)local_430);
  cv::operator-((Scalar_ *)&local_708,(Mat *)&local_728);
  cv::Mat::Mat(local_1b0);
  (**(code **)(*(long *)local_708 + 0x18))(local_708,(_InputArray *)&local_708,local_1b0,0xffffffff)
  ;
  local_748 = 0x406fe00000000000;
  uStack_740 = 0;
  local_738 = 0;
  uStack_730 = 0;
  filter_red((Mat *)local_3d0);
  cv::operator-((Scalar_ *)&local_598,(Mat *)&local_748);
  cv::Mat::Mat(local_150);
  (**(code **)(*local_598 + 0x18))(local_598,(_InputArray *)&local_598,local_150,0xffffffff);
  local_768 = 0x406fe00000000000;
  uStack_760 = 0;
  local_758 = 0;
  uStack_750 = 0;
  filter_blue((Mat *)local_210);
  cv::operator-((Scalar_ *)local_370,(Mat *)&local_768);
  cv::Mat::Mat(local_f0);
  (**(code **)(*(long *)CONCAT44(local_370._4_4_,local_370._0_4_) + 0x18))
            ((long *)CONCAT44(local_370._4_4_,local_370._0_4_),local_370,local_f0);
  cv::Mat::clone();
  cv::Mat::~Mat(aMStack_2a0);
  cv::Mat::~Mat(local_300);
  cv::Mat::~Mat((Mat *)(local_370 + 0x10));
  cv::Mat::~Mat((Mat *)local_210);
  cv::Mat::~Mat(aMStack_4c8);
  cv::Mat::~Mat(local_528);
  cv::Mat::~Mat((Mat *)&SStack_588);
  cv::Mat::~Mat((Mat *)local_3d0);
  cv::Mat::~Mat(aMStack_638);
  cv::Mat::~Mat(local_698);
  cv::Mat::~Mat((Mat *)&local_6f8);
  cv::Mat::~Mat((Mat *)local_430);
  local_6f8.width = 0;
  local_6f8.height = 0;
  local_708 = (Mat *)CONCAT44(local_708._4_4_,0x1010000);
  SStack_588.width = 0;
  SStack_588.height = 0;
  local_598 = (long *)CONCAT44(local_598._4_4_,0x2010000);
  pMStack_700 = (Mat *)local_90;
  pMStack_590 = (Mat *)local_90;
  cv::cvtColor((cv *)&local_708,(_InputArray *)&local_598,(_OutputArray *)0x43,0,in_R8D);
  SStack_360.width = 0;
  SStack_360.height = 0;
  local_370._0_4_ = 0x1010000;
  local_6f8.width = 0;
  local_6f8.height = 0;
  uStack_6f0 = 0;
  local_708 = (Mat *)0x0;
  pMStack_700 = (Mat *)0x0;
  local_430[0].flags = -0x3efdfffa;
  local_430[0].sz.width = 1;
  local_430[0].sz.height = 4;
  local_598 = (long *)0x406fe00000000000;
  pMStack_590 = (Mat *)0x4061800000000000;
  SStack_588.width = 0;
  SStack_588.height = 0x40540000;
  uStack_580 = 0;
  local_3d0[0].flags = -0x3efdfffa;
  local_3d0[0].sz.width = 1;
  local_3d0[0].sz.height = 4;
  local_210[0].super__InputArray.sz.width = 0;
  local_210[0].super__InputArray.sz.height = 0;
  local_210[0].super__InputArray.flags = 0x2010000;
  local_430[0].obj = (_InputArray *)&local_708;
  local_3d0[0].obj = (_InputArray *)&local_598;
  local_370._8_8_ = local_90;
  local_210[0].super__InputArray.obj = local_90;
  cv::inRange((_InputArray *)local_370,local_430,local_3d0,local_210);
  if (in_CL != '\0') {
    lVar2 = 0;
    do {
      local_708 = (Mat *)&local_6f8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_708,"black_layer","");
      cv::namedWindow((string *)&local_708,0);
      if ((Size *)local_708 != &local_6f8) {
        operator_delete(local_708,(long)local_6f8 + 1);
      }
      local_708 = (Mat *)&local_6f8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_708,"black_layer","");
      pMStack_590 = local_1b0 + lVar2;
      SStack_588.width = 0;
      SStack_588.height = 0;
      local_598 = (long *)CONCAT44(local_598._4_4_,0x1010000);
      cv::imshow((string *)&local_708,(_InputArray *)&local_598);
      if ((Size *)local_708 != &local_6f8) {
        operator_delete(local_708,(long)local_6f8 + 1);
      }
      cv::waitKey(0);
      cv::destroyAllWindows();
      lVar2 = lVar2 + 0x60;
    } while (lVar2 != 0x180);
  }
  lVar2 = 0;
  do {
    pMStack_700 = local_1b0 + lVar2;
    local_6f8.width = 0;
    local_6f8.height = 0;
    local_708 = (Mat *)CONCAT44(local_708._4_4_,0x1010000);
    pMStack_590 = (Mat *)(CONCAT71(in_register_00000011,debug) + lVar2);
    SStack_588.width = 0;
    SStack_588.height = 0;
    local_598 = (long *)CONCAT44(local_598._4_4_,0x1010000);
    SStack_360.width = 0;
    SStack_360.height = 0;
    local_370._0_4_ = 0x2010000;
    local_370._8_8_ = pMStack_700;
    p_Var1 = (_InputArray *)cv::noArray();
    cv::bitwise_and((_InputArray *)&local_708,(_InputArray *)&local_598,(_OutputArray *)local_370,
                    p_Var1);
    lVar2 = lVar2 + 0x60;
  } while (lVar2 != 0x120);
  if (in_CL != '\0') {
    lVar2 = 0;
    do {
      local_708 = (Mat *)&local_6f8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_708,"cleaned black_layer","")
      ;
      cv::namedWindow((string *)&local_708,0);
      if ((Size *)local_708 != &local_6f8) {
        operator_delete(local_708,(long)local_6f8 + 1);
      }
      local_708 = (Mat *)&local_6f8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_708,"cleaned black_layer","")
      ;
      pMStack_590 = local_1b0 + lVar2;
      SStack_588.width = 0;
      SStack_588.height = 0;
      local_598 = (long *)CONCAT44(local_598._4_4_,0x1010000);
      cv::imshow((string *)&local_708,(_InputArray *)&local_598);
      if ((Size *)local_708 != &local_6f8) {
        operator_delete(local_708,(long)local_6f8 + 1);
      }
      cv::waitKey(0);
      cv::destroyAllWindows();
      lVar2 = lVar2 + 0x60;
    } while (lVar2 != 0x180);
  }
  lVar2 = 0x60;
  do {
    local_6f8.width = 0;
    local_6f8.height = 0;
    local_708 = (Mat *)CONCAT44(local_708._4_4_,0x1010000);
    pMStack_590 = local_1b0 + lVar2;
    SStack_588.width = 0;
    SStack_588.height = 0;
    local_598 = (long *)CONCAT44(local_598._4_4_,0x1010000);
    SStack_360.width = 0;
    SStack_360.height = 0;
    local_370._0_4_ = 0x2010000;
    pMStack_700 = local_1b0;
    local_370._8_8_ = local_1b0;
    p_Var1 = (_InputArray *)cv::noArray();
    cv::bitwise_or((_InputArray *)&local_708,(_InputArray *)&local_598,(_OutputArray *)local_370,
                   p_Var1);
    lVar2 = lVar2 + 0x60;
  } while (lVar2 != 0x180);
  SStack_360.width = 0;
  SStack_360.height = 0;
  local_370._0_4_ = 0x1010000;
  local_430[0].sz.width = 0;
  local_430[0].sz.height = 0;
  local_430[0].flags = 0x2010000;
  local_430[0].obj = local_1b0;
  local_370._8_8_ = local_1b0;
  cv::Mat::Mat((Mat *)&local_708);
  local_3d0[0].sz.width = 0;
  local_3d0[0].sz.height = 0;
  local_3d0[0].flags = 0x1010000;
  local_5a0 = 0xffffffffffffffff;
  local_598 = (long *)0x7fefffffffffffff;
  pMStack_590 = (Mat *)0x7fefffffffffffff;
  SStack_588.width = -1;
  SStack_588.height = 0x7fefffff;
  uStack_580 = 0x7fefffffffffffff;
  local_3d0[0].obj = (_InputArray *)&local_708;
  cv::erode(local_370,local_430,local_3d0,&local_5a0,4,0,(_InputArray *)&local_598);
  cv::Mat::~Mat((Mat *)&local_708);
  SStack_360.width = 0;
  SStack_360.height = 0;
  local_370._0_4_ = 0x1010000;
  local_430[0].sz.width = 0;
  local_430[0].sz.height = 0;
  local_430[0].flags = 0x2010000;
  local_430[0].obj = local_1b0;
  local_370._8_8_ = local_1b0;
  cv::Mat::Mat((Mat *)&local_708,8,8,0);
  local_3d0[0].sz.width = 0;
  local_3d0[0].sz.height = 0;
  local_3d0[0].flags = 0x1010000;
  local_5a8 = 0xffffffffffffffff;
  local_598 = (long *)0x7fefffffffffffff;
  pMStack_590 = (Mat *)0x7fefffffffffffff;
  SStack_588.width = -1;
  SStack_588.height = 0x7fefffff;
  uStack_580 = 0x7fefffffffffffff;
  local_3d0[0].obj = (_InputArray *)&local_708;
  cv::dilate(local_370,local_430,local_3d0,&local_5a8,8,0,(_InputArray *)&local_598);
  cv::Mat::~Mat((Mat *)&local_708);
  cv::Mat::Mat(img,local_1b0);
  lVar2 = 0x120;
  do {
    cv::Mat::~Mat(local_1b0 + lVar2);
    lVar2 = lVar2 + -0x60;
  } while (lVar2 != -0x60);
  return img;
}

Assistant:

cv::Mat filter_arrow(const cv::Mat& img, const std::array<cv::Mat, 5>& target_filled, bool debug)
{
    std::array<cv::Mat, 4> colours {
        255 - filter_yellow(img), 255 - filter_red(img), 255 - filter_blue(img), img.clone()};
    cv::cvtColor(colours[3], colours[3], cv::COLOR_RGB2HSV_FULL);
    cv::inRange(colours[3], cv::Scalar(0, 0, 0), cv::Scalar(255, 140, 80), colours[3]);

    if(debug)
    {
        for(const auto& mat : colours)
        {
            cv::namedWindow("black_layer", cv::WINDOW_NORMAL);
            cv::imshow("black_layer", mat);
            cv::waitKey(0);
            cv::destroyAllWindows();
        }
    }
    assert(colours.size() > 3 && target_filled.size() >= colours.size());
    for(std::size_t i = 0; i < 3; i++)
    {
        cv::bitwise_and(colours[i], target_filled[i], colours[i]);
    }

    if(debug)
    {
        for(const auto& mat : colours)
        {
            cv::namedWindow("cleaned black_layer", cv::WINDOW_NORMAL);
            cv::imshow("cleaned black_layer", mat);
            cv::waitKey(0);
            cv::destroyAllWindows();
        }
    }

    for(std::size_t i = 1; i < colours.size(); i++)
    {
        cv::bitwise_or(colours[0], colours[i], colours[0]);
    }

    cv::erode(colours[0], colours[0], cv::Mat(), cv::Point(-1, -1), 4);
    cv::dilate(colours[0], colours[0], cv::Mat(8, 8, 0), cv::Point(-1, -1), 8);

    return colours[0];
}